

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O3

void __thiscall runtime::VirtualMachine::Invoke(VirtualMachine *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  element_type *peVar3;
  pointer pVVar4;
  undefined8 uVar5;
  size_t __n;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  Variable VVar10;
  string local_68;
  undefined1 auStack_48 [8];
  vector<runtime::Variable,_std::allocator<runtime::Variable>_> args;
  
  __n = getByteCodeParameter(this);
  auStack_48 = (undefined1  [8])0x0;
  args.super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  args.super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::reserve
            ((vector<runtime::Variable,_std::allocator<runtime::Variable>_> *)auStack_48,__n);
  if ((this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (element_type *)0x0) {
LAB_00116bfe:
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"No stack frame found in Invoke","");
    panic(this,&local_68);
  }
  if (__n != 0) {
    do {
      VVar10 = popOpStack(this);
      local_68._M_string_length = (size_type)VVar10.field_1;
      local_68._M_dataplus._M_p._0_4_ = VVar10.type;
      if (args.super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl.
          super__Vector_impl_data._M_start ==
          args.super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::
        _M_realloc_insert<runtime::Variable>
                  ((vector<runtime::Variable,_std::allocator<runtime::Variable>_> *)auStack_48,
                   (iterator)
                   args.super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>.
                   _M_impl.super__Vector_impl_data._M_start,(Variable *)&local_68);
      }
      else {
        *(pointer *)
         args.super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl.
         super__Vector_impl_data._M_start = local_68._M_dataplus._M_p;
        ((args.super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl.
          super__Vector_impl_data._M_start)->field_1).integerValue = local_68._M_string_length;
        args.super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl.
        super__Vector_impl_data._M_start =
             args.super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      __n = __n - 1;
    } while (__n != 0);
  }
  VVar10 = popOpStack(this);
  if (VVar10.type == Function) {
    pushStackFrame(this,VVar10.field_1.functionValue);
    lVar6 = (long)args.super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>.
                  _M_impl.super__Vector_impl_data._M_start - (long)auStack_48;
    if (lVar6 != 0) {
      uVar8 = lVar6 >> 4;
      lVar7 = 0;
      uVar9 = 0;
      do {
        uVar8 = uVar8 - 1;
        peVar3 = (this->stackFrame).
                 super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        pVVar4 = (peVar3->locals).
                 super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(peVar3->locals).
                          super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pVVar4 >> 4) <= uVar9)
        break;
        if ((ulong)((long)args.
                          super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>.
                          _M_impl.super__Vector_impl_data._M_start - (long)auStack_48 >> 4) <= uVar8
           ) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
          goto LAB_00116bfe;
        }
        puVar1 = (undefined8 *)((long)&((pointer)((long)auStack_48 + -0x10))->type + lVar6);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pVVar4->type + lVar7);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        uVar9 = uVar9 + 1;
        lVar7 = lVar7 + 0x10;
        lVar6 = lVar6 + -0x10;
      } while (uVar8 != 0);
    }
  }
  else {
    pushOpStack(this,(Variable)ZEXT816(0));
    peVar3 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    peVar3->programCounter = peVar3->programCounter + 1;
  }
  if (auStack_48 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_48,
                    (long)args.
                          super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)auStack_48);
  }
  return;
}

Assistant:

void runtime::VirtualMachine::Invoke() {

  std::size_t argCount = this->getByteCodeParameter();

  std::vector<runtime::Variable> args;
  args.reserve(argCount);

  if (this->stackFrame == nullptr) {
    this->panic("No stack frame found in Invoke");
    return;
  }

  // index 0 <- arg n
  // index 1 <- arg n - 1
  // index n - 1 <- arg 1
  // index n <- arg 0

  for (std::size_t i = 0; i < argCount; i++) {
    args.push_back(this->popOpStack());
  }

  Variable top = this->popOpStack();

  if (top.type != VariableType::Function) {
    this->pushUndefined();
    this->advance();
    return;
  }

  this->pushStackFrame(top.functionValue);

  for (
    std::size_t stackFrameLocalIndex = 0, i = args.size();
    i-- > 0 && stackFrameLocalIndex < this->stackFrame->locals.size();
    stackFrameLocalIndex++
  ) {
    this->stackFrame->locals.at(stackFrameLocalIndex) = args.at(i);
  }
}